

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O1

void __thiscall
cppnet::TimerContainer::DoTimer
          (TimerContainer *this,
          vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
          *run_timer_solts,
          vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
          *sub_timer_solts)

{
  _Atomic_word *p_Var1;
  int iVar2;
  TimerSlot *pTVar3;
  element_type *peVar4;
  TimerContainer *this_00;
  int iVar5;
  uint32_t uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  pointer pwVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar10;
  shared_ptr<cppnet::TimerSlot> local_68;
  TimerSlot *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  TimerSlot *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
  *local_38;
  
  pwVar9 = (run_timer_solts->
           super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_38 = run_timer_solts;
  if (pwVar9 != (run_timer_solts->
                super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      p_Var7 = (pwVar9->super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar5 = p_Var7->_M_use_count;
        do {
          if (iVar5 == 0) {
            p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            break;
          }
          LOCK();
          iVar2 = p_Var7->_M_use_count;
          bVar10 = iVar5 == iVar2;
          if (bVar10) {
            p_Var7->_M_use_count = iVar5 + 1;
            iVar2 = iVar5;
          }
          iVar5 = iVar2;
          UNLOCK();
        } while (!bVar10);
      }
      if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar10 = true;
      }
      else {
        bVar10 = p_Var7->_M_use_count == 0;
      }
      pTVar3 = (pwVar9->super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (pTVar3 != (TimerSlot *)0x0 && !bVar10) {
        (**pTVar3->_vptr_TimerSlot)(pTVar3);
        TimerSlot::RmInTimer(pTVar3);
        bVar10 = TimerSlot::IsAlways(pTVar3);
        if (bVar10) {
          TimerSlot::ResetTime(pTVar3);
          this_01 = (this->_root_timer).
                    super___weak_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            iVar5 = this_01->_M_use_count;
            do {
              if (iVar5 == 0) {
                this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                break;
              }
              LOCK();
              iVar2 = this_01->_M_use_count;
              bVar10 = iVar5 == iVar2;
              if (bVar10) {
                this_01->_M_use_count = iVar5 + 1;
                iVar2 = iVar5;
              }
              iVar5 = iVar2;
              UNLOCK();
            } while (!bVar10);
          }
          if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            bVar10 = true;
          }
          else {
            bVar10 = this_01->_M_use_count == 0;
          }
          peVar4 = (this->_root_timer).
                   super___weak_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((bool)(peVar4 == (element_type *)0x0 | bVar10)) {
            if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var7->_M_weak_count = p_Var7->_M_weak_count + 1;
                UNLOCK();
              }
              else {
                p_Var7->_M_weak_count = p_Var7->_M_weak_count + 1;
              }
            }
            local_58 = pTVar3;
            local_50 = p_Var7;
            uVar6 = TimerSlot::GetTotalInterval(pTVar3);
            bVar10 = TimerSlot::IsAlways(pTVar3);
            (**(this->super_Timer)._vptr_Timer)(this,&local_58,(ulong)uVar6,(ulong)bVar10);
            p_Var8 = local_50;
          }
          else {
            if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var7->_M_weak_count = p_Var7->_M_weak_count + 1;
                UNLOCK();
              }
              else {
                p_Var7->_M_weak_count = p_Var7->_M_weak_count + 1;
              }
            }
            local_48 = pTVar3;
            local_40 = p_Var7;
            uVar6 = TimerSlot::GetTotalInterval(pTVar3);
            bVar10 = TimerSlot::IsAlways(pTVar3);
            (**(peVar4->super_Timer)._vptr_Timer)(peVar4,&local_48,(ulong)uVar6,(ulong)bVar10);
            p_Var8 = local_40;
          }
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var1 = &p_Var8->_M_weak_count;
              iVar5 = *p_Var1;
              *p_Var1 = *p_Var1 + -1;
              UNLOCK();
            }
            else {
              iVar5 = p_Var8->_M_weak_count;
              p_Var8->_M_weak_count = iVar5 + -1;
            }
            if (iVar5 == 1) {
              (*p_Var8->_vptr__Sp_counted_base[3])();
            }
          }
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
        }
      }
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
      pwVar9 = pwVar9 + 1;
    } while (pwVar9 != (local_38->
                       super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  if (((this->_sub_timer).super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr != (element_type *)0x0) &&
     (pwVar9 = (sub_timer_solts->
               super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
     pwVar9 != (sub_timer_solts->
               super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
               )._M_impl.super__Vector_impl_data._M_finish)) {
    do {
      p_Var7 = (pwVar9->super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar5 = p_Var7->_M_use_count;
        do {
          if (iVar5 == 0) {
            p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            break;
          }
          LOCK();
          iVar2 = p_Var7->_M_use_count;
          bVar10 = iVar5 == iVar2;
          if (bVar10) {
            p_Var7->_M_use_count = iVar5 + 1;
            iVar2 = iVar5;
          }
          iVar5 = iVar2;
          UNLOCK();
        } while (!bVar10);
      }
      if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar10 = true;
      }
      else {
        bVar10 = p_Var7->_M_use_count == 0;
      }
      pTVar3 = (pwVar9->super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (!(bool)(pTVar3 == (TimerSlot *)0x0 | bVar10)) {
        this_00 = (this->_sub_timer).
                  super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          }
        }
        local_68.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pTVar3;
        local_68.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = p_Var7;
        uVar6 = TimerSlot::GetLeftInterval(pTVar3);
        InnerAddTimer(this_00,&local_68,uVar6);
        if (local_68.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
      pwVar9 = pwVar9 + 1;
    } while (pwVar9 != (sub_timer_solts->
                       super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void TimerContainer::DoTimer(std::vector<std::weak_ptr<TimerSlot>>& run_timer_solts,
    std::vector<std::weak_ptr<TimerSlot>>& sub_timer_solts) {
    // timer call back
    for (auto iter = run_timer_solts.begin(); iter != run_timer_solts.end(); iter++) {
        auto ptr = iter->lock();
        if (!ptr) {
            continue;
        }
        ptr->OnTimer();
        ptr->RmInTimer();

        // add timer again
        if (ptr->IsAlways()) {
            ptr->ResetTime();
            auto root_timer = _root_timer.lock();
            if (root_timer) {
                root_timer->AddTimer(ptr, ptr->GetTotalInterval(), ptr->IsAlways());
            }
            else {
                AddTimer(ptr, ptr->GetTotalInterval(), ptr->IsAlways());
            }
        }
    }

    // add sub timer
    if (!_sub_timer) {
        return;
    }
    for (auto iter = sub_timer_solts.begin(); iter != sub_timer_solts.end(); iter++) {
        auto ptr = iter->lock();
        if (!ptr) {
            continue;
        }
        _sub_timer->InnerAddTimer(ptr, ptr->GetLeftInterval());
    }
}